

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_command * nk__begin(nk_context *ctx)

{
  undefined4 uVar1;
  nk_vec2 nVar2;
  undefined4 uVar3;
  void *pvVar4;
  nk_window *pnVar5;
  void *pvVar6;
  nk_size nVar7;
  nk_window **ppnVar8;
  nk_cursor *img;
  nk_window *pnVar9;
  nk_window *pnVar10;
  long lVar11;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3b49,"const struct nk_command *nk__begin(struct nk_context *)");
  }
  if (ctx->count == 0) {
    return (nk_command *)0x0;
  }
  pvVar4 = (ctx->memory).memory.ptr;
  if (ctx->build != 0) goto LAB_00121ef0;
  img = (ctx->style).cursor_active;
  pvVar6 = pvVar4;
  if (img == (nk_cursor *)0x0) {
    img = (ctx->style).cursors[0];
    (ctx->style).cursor_active = img;
    if (img != (nk_cursor *)0x0) goto LAB_00121d80;
  }
  else {
LAB_00121d80:
    if (((ctx->input).mouse.grabbed == '\0') && ((ctx->style).cursor_visible != 0)) {
      (ctx->overlay).base = &ctx->memory;
      (ctx->overlay).use_clipping = 0;
      nVar7 = (ctx->memory).allocated;
      (ctx->overlay).begin = nVar7;
      (ctx->overlay).end = nVar7;
      (ctx->overlay).last = nVar7;
      (ctx->overlay).clip = nk_null_rect;
      nVar2 = (ctx->input).mouse.pos;
      uVar1 = (img->size).x;
      uVar3 = (img->size).y;
      r.h = (float)uVar3;
      r.w = (float)uVar1;
      r.x = nVar2.x - (img->offset).x;
      r.y = nVar2.y - (img->offset).y;
      nk_draw_image(&ctx->overlay,r,&img->img,(nk_color)0xffffffff);
      pvVar6 = (ctx->memory).memory.ptr;
      (ctx->overlay).end = (ctx->memory).allocated;
    }
  }
  pnVar5 = ctx->begin;
  lVar11 = 0;
  pnVar10 = pnVar5;
LAB_00121e20:
  pnVar9 = pnVar10;
  if (pnVar9 != (nk_window *)0x0) {
    nVar7 = (pnVar9->buffer).last;
    pnVar10 = pnVar9->next;
    if (((nVar7 != (pnVar9->buffer).begin) && ((pnVar9->flags & 0x2000) == 0)) &&
       (pnVar9->seq == ctx->seq)) {
      lVar11 = nVar7 + (long)pvVar6;
      for (; pnVar10 != (nk_window *)0x0; pnVar10 = pnVar10->next) {
        nVar7 = (pnVar10->buffer).begin;
        if ((((pnVar10->buffer).last != nVar7) && ((pnVar10->flags & 0x2000) == 0)) &&
           (pnVar10->seq == pnVar9->seq)) {
          *(nk_size *)(lVar11 + 8) = nVar7;
          goto LAB_00121e20;
        }
      }
      pnVar10 = (nk_window *)0x0;
    }
    goto LAB_00121e20;
  }
  while (pnVar10 = pnVar5, pnVar10 != (nk_window *)0x0) {
    pnVar5 = pnVar10->next;
    if ((pnVar10->popup).buf.active != 0) {
      *(nk_size *)(lVar11 + 8) = (pnVar10->popup).buf.begin;
      lVar11 = (pnVar10->popup).buf.last + (long)pvVar6;
      (pnVar10->popup).buf.active = 0;
    }
  }
  if (lVar11 != 0) {
    nVar7 = (ctx->overlay).begin;
    if ((ctx->overlay).end == nVar7) {
      nVar7 = (ctx->memory).allocated;
    }
    *(nk_size *)(lVar11 + 8) = nVar7;
  }
  ctx->build = 1;
LAB_00121ef0:
  ppnVar8 = &ctx->begin;
  while( true ) {
    pnVar5 = *ppnVar8;
    if (pnVar5 == (nk_window *)0x0) {
      return (nk_command *)0x0;
    }
    nVar7 = (pnVar5->buffer).begin;
    if (((nVar7 != (pnVar5->buffer).end) && ((pnVar5->flags & 0x2000) == 0)) &&
       (pnVar5->seq == ctx->seq)) break;
    ppnVar8 = &pnVar5->next;
  }
  return (nk_command *)((long)pvVar4 + nVar7);
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
    struct nk_window *iter;
    nk_byte *buffer;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    if (!ctx->count) return 0;

    buffer = (nk_byte*)ctx->memory.memory.ptr;
    if (!ctx->build) {
        nk_build(ctx);
        ctx->build = nk_true;
    }
    iter = ctx->begin;
    while (iter && ((iter->buffer.begin == iter->buffer.end) ||
        (iter->flags & NK_WINDOW_HIDDEN) || iter->seq != ctx->seq))
        iter = iter->next;
    if (!iter) return 0;
    return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}